

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_wakeupvm(HSQUIRRELVM v,SQBool wakeupret,SQBool retval,SQBool invoke_err_handler,
                    SQBool throwerror)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  long lVar3;
  SQTable *pSVar4;
  SQFloat SVar5;
  undefined4 uVar6;
  SQObjectFlags SVar7;
  undefined3 uVar8;
  bool bVar9;
  ExecutionType et;
  SQObjectPtr *pSVar10;
  SQObjectPtr *pSVar11;
  SQRESULT SVar12;
  SQObjectPtr ret;
  SQObjectPtr dummy;
  SQObject local_48;
  SQObject local_38;
  
  local_48._unVal.pTable = (SQTable *)0x0;
  local_48._type = OT_NULL;
  local_48._flags = '\0';
  local_48._5_3_ = 0;
  if (v->_suspended == 0) {
    SVar12 = -1;
    sq_throwerror(v,"cannot resume a vm that is not running any code");
  }
  else {
    lVar3 = v->_suspended_target;
    if (wakeupret == 0) {
      if (lVar3 != -1) {
        pSVar10 = SQVM::GetAt(v,lVar3 + v->_stackbase);
        pSVar4 = (pSVar10->super_SQObject)._unVal.pTable;
        SVar2 = (pSVar10->super_SQObject)._type;
        (pSVar10->super_SQObject)._type = 0;
        (pSVar10->super_SQObject)._flags = '\0';
        *(undefined3 *)&(pSVar10->super_SQObject).field_0x5 = 0;
        (pSVar10->super_SQObject)._unVal.pTable = (SQTable *)0x0;
        (pSVar10->super_SQObject)._type = OT_NULL;
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
      }
    }
    else {
      if (lVar3 != -1) {
        pSVar10 = SQVM::GetUp(v,-1);
        pSVar11 = SQVM::GetAt(v,v->_suspended_target + v->_stackbase);
        SVar2 = (pSVar11->super_SQObject)._type;
        pSVar4 = (pSVar11->super_SQObject)._unVal.pTable;
        SVar7 = (pSVar10->super_SQObject)._flags;
        uVar8 = *(undefined3 *)&(pSVar10->super_SQObject).field_0x5;
        SVar5 = (pSVar10->super_SQObject)._unVal.fFloat;
        uVar6 = *(undefined4 *)((long)&(pSVar10->super_SQObject)._unVal + 4);
        (pSVar11->super_SQObject)._type = (pSVar10->super_SQObject)._type;
        (pSVar11->super_SQObject)._flags = SVar7;
        *(undefined3 *)&(pSVar11->super_SQObject).field_0x5 = uVar8;
        (pSVar11->super_SQObject)._unVal.fFloat = SVar5;
        *(undefined4 *)((long)&(pSVar11->super_SQObject)._unVal + 4) = uVar6;
        if (((pSVar11->super_SQObject)._type & 0x8000000) != 0) {
          pSVar1 = &(((pSVar11->super_SQObject)._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
      }
      SQVM::Pop(v);
    }
    local_38._unVal.pTable = (SQTable *)0x0;
    local_38._type = OT_NULL;
    local_38._flags = '\0';
    local_38._5_3_ = 0;
    et = ET_RESUME_THROW_VM - (throwerror == 0);
    if (v->_debughook == true) {
      bVar9 = SQVM::Execute<true>(v,(SQObjectPtr *)&local_38,-1,-1,(SQObjectPtr *)&local_48,
                                  invoke_err_handler,et);
    }
    else {
      bVar9 = SQVM::Execute<false>
                        (v,(SQObjectPtr *)&local_38,-1,-1,(SQObjectPtr *)&local_48,
                         invoke_err_handler,et);
    }
    SVar12 = -1;
    if (bVar9 != false) {
      if (retval != 0) {
        SQVM::Push(v,(SQObjectPtr *)&local_48);
      }
      SVar12 = 0;
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_38);
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
  return SVar12;
}

Assistant:

SQRESULT sq_wakeupvm(HSQUIRRELVM v,SQBool wakeupret,SQBool retval,SQBool invoke_err_handler,SQBool throwerror)
{
    SQObjectPtr ret;
    if(!v->_suspended)
        return sq_throwerror(v,_SC("cannot resume a vm that is not running any code"));
    SQInteger target = v->_suspended_target;
    if(wakeupret) {
        if(target != -1) {
            v->GetAt(v->_stackbase+v->_suspended_target)=v->GetUp(-1); //retval
        }
        v->Pop();
    } else if(target != -1) { v->GetAt(v->_stackbase+v->_suspended_target).Null(); }
    SQObjectPtr dummy;

    bool res = v->_debughook ?
        v->Execute<true>(dummy,-1,-1,ret,invoke_err_handler,throwerror?SQVM::ET_RESUME_THROW_VM : SQVM::ET_RESUME_VM) :
        v->Execute<false>(dummy,-1,-1,ret,invoke_err_handler,throwerror?SQVM::ET_RESUME_THROW_VM : SQVM::ET_RESUME_VM);

    if(!res)
        return SQ_ERROR;

    if(retval)
        v->Push(ret);
    return SQ_OK;
}